

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  pointer ppcVar1;
  pointer *pppcVar2;
  pointer *pppcVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmCommand *pcVar8;
  undefined4 extraout_var;
  char *pcVar9;
  __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
  __tmp;
  pointer ppcVar10;
  string error;
  cmMakefileCall stack_manager;
  string name;
  undefined1 local_98 [32];
  cmMakefileCall local_78;
  cmCommandArgument **local_70 [2];
  cmCommandArgument *local_60 [2];
  string local_50;
  
  ppcVar10 = (this->FunctionBlockers).
             super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if ((this->FunctionBlockers).
      super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppcVar10) {
    while (ppcVar10 !=
           (this->FunctionBlockers).
           super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
           super__Vector_impl_data._M_start) {
      ppcVar1 = ppcVar10 + -1;
      ppcVar10 = ppcVar10 + -1;
      iVar7 = (**(*ppcVar1)->_vptr_cmFunctionBlocker)(*ppcVar1,lff,this,status);
      if ((char)iVar7 != '\0') {
        return true;
      }
    }
  }
  pcVar4 = (lff->super_cmCommandContext).Name._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + (lff->super_cmCommandContext).Name._M_string_length
            );
  cmMakefileCall::cmMakefileCall(&local_78,this,&lff->super_cmCommandContext,status);
  pcVar8 = cmState::GetCommand(this->GlobalGenerator->CMakeInstance->State,&local_50);
  if (pcVar8 == (cmCommand *)0x0) {
    bVar5 = true;
    if ((cmSystemTools::s_FatalErrorOccured == false) &&
       (bVar6 = cmSystemTools::GetInterruptFlag(), !bVar6)) {
      local_98._0_8_ = (cmCommand *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Unknown CMake command \"","");
      std::__cxx11::string::_M_append
                (local_98,(ulong)(lff->super_cmCommandContext).Name._M_dataplus._M_p);
      std::__cxx11::string::append(local_98);
      IssueMessage(this,FATAL_ERROR,(string *)local_98,false);
      cmSystemTools::s_FatalErrorOccured = true;
      if ((cmCommand *)local_98._0_8_ != (cmCommand *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      bVar5 = false;
    }
    goto LAB_0024acab;
  }
  iVar7 = (*(pcVar8->super_cmObject)._vptr_cmObject[8])(pcVar8);
  pcVar8 = (cmCommand *)CONCAT44(extraout_var,iVar7);
  pcVar8->Makefile = this;
  if ((((pcVar8->Enabled != true) || (cmSystemTools::s_FatalErrorOccured != false)) ||
      (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) ||
     ((this->GlobalGenerator->CMakeInstance->CurrentWorkingMode == SCRIPT_MODE &&
      (iVar7 = (*(pcVar8->super_cmObject)._vptr_cmObject[9])(pcVar8), (char)iVar7 == '\0')))) {
    bVar5 = true;
    if ((this->GlobalGenerator->CMakeInstance->CurrentWorkingMode == SCRIPT_MODE) &&
       (iVar7 = (*(pcVar8->super_cmObject)._vptr_cmObject[9])(pcVar8), (char)iVar7 == '\0')) {
      local_98._0_8_ = (cmCommand *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Command ","");
      (*(pcVar8->super_cmObject)._vptr_cmObject[0xb])(local_70,pcVar8);
      std::__cxx11::string::_M_append(local_98,(ulong)local_70[0]);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],(ulong)((long)&local_60[0]->_vptr_cmCommandArgument + 1));
      }
      std::__cxx11::string::append(local_98);
      IssueMessage(this,FATAL_ERROR,(string *)local_98,false);
      cmSystemTools::s_FatalErrorOccured = true;
      if ((cmCommand *)local_98._0_8_ != (cmCommand *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      goto LAB_0024ac9b;
    }
  }
  else {
    if (this->GlobalGenerator->CMakeInstance->Trace == true) {
      PrintCommandTrace(this,lff);
    }
    iVar7 = (*(pcVar8->super_cmObject)._vptr_cmObject[4])(pcVar8,&lff->Arguments,status);
    if (((char)iVar7 == '\0') || (status->NestedError == true)) {
      if (status->NestedError == false) {
        pcVar9 = cmCommand::GetError(pcVar8);
        std::__cxx11::string::string((string *)local_98,pcVar9,(allocator *)local_70);
        IssueMessage(this,FATAL_ERROR,(string *)local_98,false);
        if ((cmCommand *)local_98._0_8_ != (cmCommand *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
      }
      if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
        cmSystemTools::s_FatalErrorOccured = true;
      }
LAB_0024ac9b:
      bVar5 = false;
    }
    else {
      iVar7 = (*(pcVar8->super_cmObject)._vptr_cmObject[7])(pcVar8);
      bVar5 = true;
      if ((char)iVar7 != '\0') {
        local_98._0_8_ = pcVar8;
        std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back
                  (&this->FinalPassCommands,(value_type *)local_98);
        pcVar8 = (cmCommand *)0x0;
      }
    }
  }
  if (pcVar8 != (cmCommand *)0x0) {
    (*(pcVar8->super_cmObject)._vptr_cmObject[1])(pcVar8);
  }
LAB_0024acab:
  pppcVar2 = &((local_78.Makefile)->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppcVar2 = *pppcVar2 + -1;
  pppcVar3 = &((local_78.Makefile)->ContextStack).
              super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppcVar3 = *pppcVar3 + -1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus &status)
{
  bool result = true;

  // quick return if blocked
  if(this->IsFunctionBlocked(lff,status))
    {
    // No error.
    return result;
    }

  std::string name = lff.Name;

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Lookup the command prototype.
  if(cmCommand* proto = this->GetState()->GetCommand(name))
    {
    // Clone the prototype.
    cmsys::auto_ptr<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if(pcmd->GetEnabled() && !cmSystemTools::GetFatalErrorOccured()  &&
       (this->GetCMakeInstance()->GetWorkingMode() != cmake::SCRIPT_MODE
       || pcmd->IsScriptable()))

      {
      // if trace is enabled, print out invoke information
      if(this->GetCMakeInstance()->GetTrace())
        {
        this->PrintCommandTrace(lff);
        }
      // Try invoking the command.
      if(!pcmd->InvokeInitialPass(lff.Arguments,status) ||
         status.GetNestedError())
        {
        if(!status.GetNestedError())
          {
          // The command invocation requested that we report an error.
          this->IssueMessage(cmake::FATAL_ERROR, pcmd->GetError());
          }
        result = false;
        if ( this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE)
          {
          cmSystemTools::SetFatalErrorOccured();
          }
        }
      else if(pcmd->HasFinalPass())
        {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
        }
      }
    else if ( this->GetCMakeInstance()->GetWorkingMode() == cmake::SCRIPT_MODE
              && !pcmd->IsScriptable() )
      {
      std::string error = "Command ";
      error += pcmd->GetName();
      error += "() is not scriptable";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
      }
    }
  else
    {
    if(!cmSystemTools::GetFatalErrorOccured())
      {
      std::string error = "Unknown CMake command \"";
      error += lff.Name;
      error += "\".";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
      }
    }

  return result;
}